

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::CreateFunctionCallSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType position;
  bool bVar2;
  ReferenceType pSVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pSVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  cmLinkedTree<cmDefinitions> *local_1a8;
  PositionType local_1a0;
  iterator origin;
  SnapshotDataType local_130;
  cmLinkedTree<cmState::SnapshotDataType> *local_48;
  PositionType PStack_40;
  undefined1 local_38 [8];
  PositionType pos;
  string *fileName_local;
  long entryPointLine_local;
  string *entryPointCommand_local;
  cmState *this_local;
  
  local_48 = originSnapshot.Position.Tree;
  PStack_40 = originSnapshot.Position.Position;
  pos.Position = (PositionType)fileName;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType(&local_130,pSVar3);
  iVar7.Position = PStack_40;
  iVar7.Tree = local_48;
  iVar7 = cmLinkedTree<cmState::SnapshotDataType>::Push(&this->SnapshotData,iVar7,&local_130);
  pos.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)iVar7.Position;
  local_38 = (undefined1  [8])iVar7.Tree;
  SnapshotDataType::~SnapshotDataType(&local_130);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  (pSVar4->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar4->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar4->EntryPointLine = entryPointLine;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  std::__cxx11::string::operator=((string *)&pSVar4->EntryPointCommand,(string *)entryPointCommand);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar4->SnapshotType = FunctionCallType;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar4->Keep = false;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar8 = pSVar4->ExecutionListFile;
  std::__cxx11::string::string((string *)&origin.Position,(string *)pos.Position);
  iVar8 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,iVar8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &origin.Position);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pSVar4->ExecutionListFile = iVar8;
  std::__cxx11::string::~string((string *)&origin.Position);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  (pBVar5->DirectoryEnd).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_38;
  (pBVar5->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  (pSVar6->PolicyScope).Tree = (pSVar4->Policies).Tree;
  (pSVar6->PolicyScope).Position = (pSVar4->Policies).Position;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  bVar2 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar4->Vars);
  if (!bVar2) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x388,
                  "cmState::Snapshot cmState::CreateFunctionCallSnapshot(cmState::Snapshot, const std::string &, long, const std::string &)"
                 );
  }
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pcVar1 = (pSVar4->Vars).Tree;
  origin.Tree = (cmLinkedTree<cmDefinitions> *)(pSVar4->Vars).Position;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  (pSVar4->Parent).Tree = pcVar1;
  (pSVar4->Parent).Position = (PositionType)origin.Tree;
  iVar9.Position = (PositionType)origin.Tree;
  iVar9.Tree = pcVar1;
  iVar9 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar9);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_38);
  local_1a8 = iVar9.Tree;
  (pSVar4->Vars).Tree = local_1a8;
  local_1a0 = iVar9.Position;
  (pSVar4->Vars).Position = local_1a0;
  position.Position = (PositionType)pos.Tree;
  position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_38;
  Snapshot::Snapshot(__return_storage_ptr__,this,position);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreateFunctionCallSnapshot(cmState::Snapshot originSnapshot,
                                    std::string const& entryPointCommand,
                                    long entryPointLine,
                                    std::string const& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = FunctionCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());
  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  return cmState::Snapshot(this, pos);
}